

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int m_zero_block(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint32_t local_38;
  int b;
  uint32_t zero_bytes;
  uint32_t zero_samples;
  uint32_t zero_blocks;
  internal_state_conflict *state;
  aec_stream_conflict *strm_local;
  
  piVar1 = strm->state;
  uVar2 = fs_ask(strm);
  if (uVar2 == 0) {
    strm_local._4_4_ = 0;
  }
  else {
    uVar2 = piVar1->fs;
    zero_bytes = uVar2 + 1;
    fs_drop(strm);
    if (zero_bytes == 5) {
      iVar3 = (int)(((long)piVar1->rsip - (long)piVar1->rsi_buffer >> 2 & 0xffffffffU) /
                   (ulong)strm->block_size);
      if ((int)(strm->rsi - iVar3) < 0x40 - iVar3 % 0x40) {
        local_38 = strm->rsi - iVar3;
      }
      else {
        local_38 = 0x40 - iVar3 % 0x40;
      }
      zero_bytes = local_38;
    }
    else if (5 < zero_bytes) {
      zero_bytes = uVar2;
    }
    uVar4 = zero_bytes * strm->block_size - piVar1->ref;
    if (piVar1->rsi_size - ((long)piVar1->rsip - (long)piVar1->rsi_buffer >> 2) < (ulong)uVar4) {
      strm_local._4_4_ = -1;
    }
    else {
      uVar5 = uVar4 * piVar1->bytes_per_sample;
      if (strm->avail_out < (ulong)uVar5) {
        piVar1->sample_counter = uVar4;
        piVar1->mode = m_zero_output;
      }
      else {
        memset(piVar1->rsip,0,(ulong)uVar4 << 2);
        piVar1->rsip = piVar1->rsip + uVar4;
        strm->avail_out = strm->avail_out - (ulong)uVar5;
        piVar1->mode = m_next_cds;
      }
      strm_local._4_4_ = 1;
    }
  }
  return strm_local._4_4_;
}

Assistant:

static int m_zero_block(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    uint32_t zero_blocks;
    uint32_t zero_samples;
    uint32_t zero_bytes;

    if (fs_ask(strm) == 0)
        return M_EXIT;

    zero_blocks = state->fs + 1;
    fs_drop(strm);

    if (zero_blocks == ROS) {
        int b = (int)RSI_USED_SIZE(state) / strm->block_size;
        zero_blocks = MIN((int)(strm->rsi - b), 64 - (b % 64));
    } else if (zero_blocks > ROS) {
        zero_blocks--;
    }

    zero_samples = zero_blocks * strm->block_size - state->ref;
    if (state->rsi_size - RSI_USED_SIZE(state) < zero_samples)
        return M_ERROR;

    zero_bytes = zero_samples * state->bytes_per_sample;
    if (strm->avail_out >= zero_bytes) {
        memset(state->rsip, 0, zero_samples * sizeof(uint32_t));
        state->rsip += zero_samples;
        strm->avail_out -= zero_bytes;
        state->mode = m_next_cds;
    } else {
        state->sample_counter = zero_samples;
        state->mode = m_zero_output;
    }
    return M_CONTINUE;
}